

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

char * SplittingStepCoefficients_IDToName(ARKODE_SplittingCoefficientsID id)

{
  int in_EDI;
  char *local_8;
  
  if (in_EDI + 1U < 7 || in_EDI == 6) {
    switch((long)&switchD_0019507f::switchdataD_001ceef8 +
           (long)(int)(&switchD_0019507f::switchdataD_001ceef8)[in_EDI + 1U]) {
    case 0x195081:
      local_8 = "ARKODE_SPLITTING_NONE";
      break;
    case 0x195092:
      local_8 = "ARKODE_SPLITTING_LIE_TROTTER_1_1_2";
      break;
    case 0x1950a3:
      local_8 = "ARKODE_SPLITTING_STRANG_2_2_2";
      break;
    case 0x1950b1:
      local_8 = "ARKODE_SPLITTING_BEST_2_2_2";
      break;
    case 0x1950bf:
      local_8 = "ARKODE_SPLITTING_SUZUKI_3_3_2";
      break;
    case 0x1950cd:
      local_8 = "ARKODE_SPLITTING_RUTH_3_3_2";
      break;
    case 0x1950db:
      local_8 = "ARKODE_SPLITTING_YOSHIDA_4_4_2";
      break;
    case 0x1950e9:
      local_8 = "ARKODE_SPLITTING_YOSHIDA_8_6_2";
    }
  }
  else {
    arkProcessError((ARKodeMem)0x0,-0x16,0xdf,"SplittingStepCoefficients_IDToName",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep_coefficients.c"
                    ,"Unknown splitting coefficients");
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* SplittingStepCoefficients_IDToName(
  const ARKODE_SplittingCoefficientsID id)
{
  /* Use X-macro to test each coefficient name */
  switch (id)
  {
#define ARK_SPLITTING_COEFFICIENTS(name, coeff) \
  case name: return #name;
#include "arkode_splittingstep_coefficients.def"
#undef ARK_SPLITTING_COEFFICIENTS

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown splitting coefficients");
    return NULL;
  }
}